

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polysolver.h
# Opt level: O0

vector<double,_std::allocator<double>_> *
Poly_Solver::poly_solve(vector<double,_std::allocator<double>_> *v,double l,double r,double eps)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pdVar4;
  double *pdVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  float fVar7;
  double *in_XMM0_Qa;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  double *in_XMM1_Qa;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double in_XMM2_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int j_1;
  vector<double,_std::allocator<double>_> nx;
  int j;
  double g;
  double *t_1;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  double t;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  double mx;
  int tat;
  int retry;
  vector<double,_std::allocator<double>_> dv;
  vector<double,_std::allocator<double>_> *s;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  iterator in_stack_fffffffffffffe58;
  mt19937 *in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe80;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef4;
  vector<double,_std::allocator<double>_> local_108;
  int local_ec;
  double *local_e8;
  vector<double,_std::allocator<double>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  reference local_b0;
  double *local_a8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a0 [2];
  double local_90;
  double local_88;
  double *local_80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78 [2];
  double local_68;
  int local_5c;
  int local_58;
  undefined1 local_51;
  double local_28;
  double *local_20;
  double *local_18;
  undefined1 extraout_var [56];
  
  local_28 = in_XMM2_Qa;
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  if ((poly_solve(std::vector<double,std::allocator<double>>,double,double,double)::rng == '\0') &&
     (iVar2 = __cxa_guard_acquire(&poly_solve(std::vector<double,std::allocator<double>>,double,double,double)
                                   ::rng), iVar2 != 0)) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)0x27fb30);
    __cxa_guard_release(&poly_solve(std::vector<double,std::allocator<double>>,double,double,double)
                         ::rng);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x27fb4b);
  local_51 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x27fb60);
  local_58 = 0;
  local_5c = 0;
  do {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar3 < 2) break;
    local_68 = 0.0;
    local_78[0]._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe48);
    local_80 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_fffffffffffffe50,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_fffffffffffffe48), bVar1) {
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(local_78);
      local_88 = *pdVar4;
      auVar14._8_8_ = 0x7fffffffffffffff;
      auVar14._0_8_ = 0x7fffffffffffffff;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_88;
      auVar10 = vpand_avx(auVar10,auVar14);
      local_90 = (double)vmovlpd_avx(auVar10);
      pdVar5 = std::max<double>(&local_68,&local_90);
      local_68 = *pdVar5;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(local_78);
    }
    if ((local_68 != 0.0) || (NAN(local_68))) {
      local_a0[0]._M_current =
           (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe48);
      local_a8 = (double *)
                 std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe48);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffe50,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffe48), bVar1) {
        local_b0 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(local_a0);
        *local_b0 = *local_b0 / local_68;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(local_a0);
      }
    }
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe98 = &local_c8;
    in_stack_fffffffffffffea0 = &local_e0;
    de(in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe58._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    pdVar5 = local_18;
    fVar7 = randf(in_stack_fffffffffffffe60);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = pdVar5;
    auVar15._0_8_ = (double)fVar7;
    auVar15._8_8_ = extraout_XMM0_Qb;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (double)local_20 - (double)local_18;
    auVar10 = vfmadd213sd_fma(auVar11,auVar15,auVar18);
    local_e8 = auVar10._0_8_;
    local_5c = local_5c + 1;
    if (local_5c % 5 == 0) {
      local_e8 = local_18;
    }
    else if (local_5c % 5 == 1) {
      local_e8 = local_20;
    }
    for (local_ec = 1; pdVar5 = local_e8, local_ec < 0x1f; local_ec = local_ec + 1) {
      dVar8 = poly_calc(in_stack_fffffffffffffe80,(double)in_stack_fffffffffffffe78);
      dVar9 = poly_calc(in_stack_fffffffffffffe80,(double)in_stack_fffffffffffffe78);
      local_e8 = (double *)((double)pdVar5 - dVar8 / dVar9);
      if ((10000000000.0 < (double)local_e8) || ((double)local_e8 < -10000000000.0)) break;
    }
    if ((10000000000.0 < (double)local_e8) || ((double)local_e8 < -10000000000.0)) {
      local_58 = local_58 + 1;
    }
    else {
      auVar13._0_8_ = poly_calc(in_stack_fffffffffffffe80,(double)in_stack_fffffffffffffe78);
      auVar13._8_56_ = extraout_var;
      auVar16._8_8_ = 0x7fffffffffffffff;
      auVar16._0_8_ = 0x7fffffffffffffff;
      auVar10 = vpand_avx(auVar13._0_16_,auVar16);
      if (auVar10._0_8_ <= local_28) {
        local_58 = 0;
        if (((double)local_18 <= (double)local_e8) && ((double)local_e8 <= (double)local_20)) {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58._M_current);
        }
        in_stack_fffffffffffffe78 =
             (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(in_RSI);
        in_stack_fffffffffffffe80 =
             (vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffef7;
        std::allocator<double>::allocator((allocator<double> *)0x280039);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_current,
                   (allocator_type *)in_stack_fffffffffffffe60);
        std::allocator<double>::~allocator((allocator<double> *)0x28005f);
        sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
        iVar2 = (int)sVar3;
        while (iVar2 = iVar2 + -1, 0 < iVar2) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar2);
          in_stack_fffffffffffffe60 = (mt19937 *)*pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_108,(long)iVar2);
          *pvVar6 = (value_type)in_stack_fffffffffffffe60;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar2);
          in_stack_fffffffffffffe70 = (vector<double,_std::allocator<double>_> *)*pvVar6;
          in_stack_fffffffffffffe68._M_current = local_e8;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(iVar2 + -1));
          auVar12._8_8_ = 0;
          auVar12._0_8_ = in_stack_fffffffffffffe68._M_current;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = in_stack_fffffffffffffe70;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *pvVar6;
          auVar10 = vfmadd213sd_fma(auVar12,auVar17,auVar19);
          *pvVar6 = auVar10._0_8_;
        }
        in_stack_fffffffffffffe50 = &local_108;
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe48);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                    *)in_stack_fffffffffffffe50,
                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe58 =
             std::vector<double,_std::allocator<double>_>::erase
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe68);
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,iVar2),in_stack_fffffffffffffee8);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
      }
      else {
        local_58 = local_58 + 2;
      }
    }
  } while (local_58 < 0xe);
  local_51 = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
  return in_RDI;
}

Assistant:

vector<double> poly_solve(vector<double> v, double l, double r, double eps = 1e-8) {
		static RNG_TYPE rng;
		vector<double> dv, s;
		int retry = 0, tat=0;
		while (v.size() > 1) {
			double mx = 0;
			for (auto t : v) mx = max(mx, fabs(t));
			if (mx)
			{
				for (auto& t : v) t /= mx;
			}
			dv = de(v);
			double g = l + randf(rng) * (r - l);
			++tat;
			if (tat % 5 == 0) g = l;
			else if (tat % 5 == 1) g = r;
			for (int j = 1; j <= 30; ++j) {
				g = g - poly_calc(v, g) / poly_calc(dv, g);
				if (g != g || g > 1e10 || g < -1e10)
					break;
			}
			if (g != g || g > 1e10 || g < -1e10) ++retry;
			else if (fabs(poly_calc(v, g)) > eps) retry += 2;
			else {
				retry = 0;
				if (g >= l && g <= r) s.push_back(g);
				vector<double> nx(v.size());
				//v/(x-g)
				for (int j = (int)v.size() - 1; j >= 1; --j) {
					nx[j] = v[j]; v[j - 1] += v[j] * g;
				}
				nx.erase(nx.begin()); v = nx;
			}
			if (retry >= 14) break;
		}
		return s;
		/*
		if (v.size() == 0)
			return vector<double>();
//		v = poly_normalized(v);
		vector<double> w = poly_solve(de(v), l, r, eps, false), o;
		w.insert(w.begin(), l);
		w.push_back(r);
		for (int j = 0; j + 1 < (int)w.size(); ++j) {
			double a = w[j], b = w[j+1], fa = poly_calc(v, a), fb = poly_calc(v, b);
			if (fabs(fa) < eps) {
				o.push_back(a);
				continue;
			}
			if (fabs(fb) < eps) {
				o.push_back(b);
				continue;
			}
			if ((fa > 0) == (fb > 0))
				continue;
			for (int k = 0; k < 100 && (a!=b); ++k) {
				double m = (a + b) / 2, fm = poly_calc(v, m);
				if ((fa > 0) ^ (fm > 0)) b = m, fb = fm;
				else a = m, fa = fm;
			}
			o.push_back(a);
		}
		if (verify)
		{
			vector<double> oo;
			for (auto g : o)
				if (fabs(poly_calc(v, g)) < eps) oo.push_back(g);
			o = oo;
		}
		return o;*/
	}